

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitm.c
# Opt level: O2

int hitmm(monst *magr,monst *mdef,attack *mattk)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  obj *poVar4;
  char *pcVar5;
  char *pcVar6;
  char buf [256];
  char magr_name [256];
  char mdef_name [256];
  
  if (vis == '\0') {
    noises(magr,mattk);
    goto LAB_001bee28;
  }
  if (magr->wormno == '\0') {
    if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001be815;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001be80c;
      }
      else {
LAB_001be80c:
        if (ublindf == (obj *)0x0) goto LAB_001be8c4;
LAB_001be815:
        if (ublindf->oartifact != '\x1d') goto LAB_001be8c4;
      }
      if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) || ((viz_array[magr->my][magr->mx] & 1U) == 0)
          ) || ((magr->data->mflags3 & 0x200) == 0)) goto LAB_001be8c4;
    }
LAB_001be870:
    uVar1 = *(uint *)&magr->field_0x60;
    if ((((uVar1 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_001be8b7;
      goto LAB_001be8c4;
    }
    if ((uVar1 & 0x280) != 0) goto LAB_001be8c4;
LAB_001be8b7:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_001be8c4;
  }
  else {
    bVar2 = worm_known(level,magr);
    if (bVar2 != '\0') goto LAB_001be870;
LAB_001be8c4:
    if (((magr->data->mflags1 & 0x10000) == 0) &&
       ((poVar4 = which_armor(magr,4), poVar4 == (obj *)0x0 ||
        (poVar4 = which_armor(magr,4), poVar4->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001be919;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001be914;
      }
      else {
LAB_001be914:
        if (ublindf != (obj *)0x0) {
LAB_001be919:
          if (ublindf->oartifact == '\x1d') goto LAB_001be9b3;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001bea30;
      }
LAB_001be9b3:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar3 = dist2((int)magr->mx,(int)magr->my,(int)u.ux,(int)u.uy), iVar3 < 0x41))))
      goto LAB_001bea30;
    }
    if ((u.uprops[0x42].intrinsic == 0) &&
       ((u.uprops[0x42].extrinsic == 0 && (bVar2 = match_warn_of_mon(magr), bVar2 == '\0')))) {
      map_invisible(magr->mx,magr->my);
    }
  }
LAB_001bea30:
  if (mdef->wormno == '\0') {
    if ((viz_array[mdef->my][mdef->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bea98;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bea8f;
      }
      else {
LAB_001bea8f:
        if (ublindf == (obj *)0x0) goto LAB_001beb47;
LAB_001bea98:
        if (ublindf->oartifact != '\x1d') goto LAB_001beb47;
      }
      if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) || ((viz_array[mdef->my][mdef->mx] & 1U) == 0)
          ) || ((mdef->data->mflags3 & 0x200) == 0)) goto LAB_001beb47;
    }
LAB_001beaf3:
    uVar1 = *(uint *)&mdef->field_0x60;
    if ((((uVar1 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_001beb3a;
      goto LAB_001beb47;
    }
    if ((uVar1 & 0x280) != 0) goto LAB_001beb47;
LAB_001beb3a:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_001beb47;
  }
  else {
    bVar2 = worm_known(level,mdef);
    if (bVar2 != '\0') goto LAB_001beaf3;
LAB_001beb47:
    if (((mdef->data->mflags1 & 0x10000) == 0) &&
       ((poVar4 = which_armor(mdef,4), poVar4 == (obj *)0x0 ||
        (poVar4 = which_armor(mdef,4), poVar4->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001beb9c;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001beb97;
      }
      else {
LAB_001beb97:
        if (ublindf != (obj *)0x0) {
LAB_001beb9c:
          if (ublindf->oartifact == '\x1d') goto LAB_001bec36;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001becb3;
      }
LAB_001bec36:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar3 = dist2((int)mdef->mx,(int)mdef->my,(int)u.ux,(int)u.uy), iVar3 < 0x41))))
      goto LAB_001becb3;
    }
    if ((u.uprops[0x42].intrinsic == 0) &&
       ((u.uprops[0x42].extrinsic == 0 && (bVar2 = match_warn_of_mon(mdef), bVar2 == '\0')))) {
      map_invisible(mdef->mx,mdef->my);
    }
  }
LAB_001becb3:
  if (mdef->m_ap_type != '\0') {
    seemimic(mdef);
  }
  if (magr->m_ap_type != '\0') {
    seemimic(magr);
  }
  iVar3 = could_seduce(magr,mdef,mattk);
  if ((iVar3 != 0) && ((magr->field_0x61 & 1) == 0)) {
    pcVar5 = Monnam(magr);
    pcVar6 = "smiles at";
    if ((*(uint *)&mdef->field_0x60 >> 0x11 & 1) == 0) {
      pcVar6 = "talks to";
    }
    sprintf(buf,"%s %s",pcVar5,pcVar6);
    pcVar5 = mon_nam(mdef);
    pcVar6 = "seductively";
    if (iVar3 == 2) {
      pcVar6 = "engagingly";
    }
    pline("%s %s %s.",buf,pcVar5,pcVar6);
    goto LAB_001bee28;
  }
  pcVar5 = Monnam(magr);
  strcpy(magr_name,pcVar5);
  switch(mattk->aatyp) {
  case '\x02':
    pcVar6 = "%s bites";
    break;
  default:
switchD_001bed8a_caseD_3:
    pcVar6 = "%s hits";
    break;
  case '\x04':
    pcVar6 = "%s butts";
    break;
  case '\x05':
    pcVar6 = "%s touches";
    break;
  case '\x06':
    pcVar6 = "%s stings";
    break;
  case '\a':
    if (u.ustuck == magr) goto switchD_001bed8a_caseD_3;
    pcVar6 = "%s squeezes";
    break;
  case '\x10':
    pcVar5 = s_suffix(magr_name);
    pcVar6 = "%s tentacles suck";
    goto LAB_001bedf7;
  }
  pcVar5 = magr_name;
LAB_001bedf7:
  sprintf(buf,pcVar6,pcVar5);
  mon_nam_too(mdef_name,mdef,magr);
  pline("%s %s.",buf,mdef_name);
LAB_001bee28:
  iVar3 = mdamagem(magr,mdef,mattk);
  return iVar3;
}

Assistant:

static int hitmm(struct monst *magr, struct monst *mdef, const struct attack *mattk)
{
	if (vis){
		int compat;
		char buf[BUFSZ], mdef_name[BUFSZ];

		if (!canspotmon(level, magr))
		    map_invisible(magr->mx, magr->my);
		if (!canspotmon(level, mdef))
		    map_invisible(mdef->mx, mdef->my);
		if (mdef->m_ap_type) seemimic(mdef);
		if (magr->m_ap_type) seemimic(magr);
		if ((compat = could_seduce(magr,mdef,mattk)) && !magr->mcan) {
			sprintf(buf, "%s %s", Monnam(magr),
				mdef->mcansee ? "smiles at" : "talks to");
			pline("%s %s %s.", buf, mon_nam(mdef),
				compat == 2 ?
					"engagingly" : "seductively");
		} else {
		    char magr_name[BUFSZ];

		    strcpy(magr_name, Monnam(magr));
		    switch (mattk->aatyp) {
			case AT_BITE:
				sprintf(buf,"%s bites", magr_name);
				break;
			case AT_STNG:
				sprintf(buf,"%s stings", magr_name);
				break;
			case AT_BUTT:
				sprintf(buf,"%s butts", magr_name);
				break;
			case AT_TUCH:
				sprintf(buf,"%s touches", magr_name);
				break;
			case AT_TENT:
				sprintf(buf, "%s tentacles suck",
					s_suffix(magr_name));
				break;
			case AT_HUGS:
				if (magr != u.ustuck) {
				    sprintf(buf,"%s squeezes", magr_name);
				    break;
				}
			default:
				sprintf(buf,"%s hits", magr_name);
		    }
		    pline("%s %s.", buf, mon_nam_too(mdef_name, mdef, magr));
		}
	} else  noises(magr, mattk);
	return mdamagem(magr, mdef, mattk);
}